

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.c
# Opt level: O2

int mixed_register_segment
              (char *name,uint32_t argc,mixed_segment_field_info *args,
              mixed_make_segment_function function)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  segment_entry *psVar5;
  segment_entry *psVar6;
  
  if (argc < 0x21) {
    sVar2 = strlen(name);
    if ((uint)sVar2 < 0x41) {
      uVar3 = (ulong)segments.count;
      if (uVar3 < 0x400) {
        lVar4 = 0;
        psVar6 = (segment_entry *)0x0;
        while( true ) {
          if (uVar3 * 0x450 - lVar4 == 0) {
            psVar5 = segments.entries + uVar3;
            if (psVar6 != (segment_entry *)0x0) {
              psVar5 = psVar6;
            }
            memcpy(psVar5,name,(ulong)((uint)sVar2 & 0x7f));
            psVar5->argc = argc;
            memcpy(psVar5->args,args,(ulong)(argc << 5));
            psVar5->function = function;
            segments.count = segments.count + 1;
            return 1;
          }
          psVar5 = (segment_entry *)(segments.entries[0].name + lVar4);
          if (((psVar6 != (segment_entry *)0x0) ||
              (*(long *)((long)segments.entries[0].args + lVar4 + -8) != 0)) &&
             (iVar1 = strcmp((char *)psVar5,name), psVar5 = psVar6, iVar1 == 0)) break;
          lVar4 = lVar4 + 0x450;
          psVar6 = psVar5;
        }
        iVar1 = 0x17;
      }
      else {
        iVar1 = 1;
      }
    }
    else {
      iVar1 = 0x1a;
    }
  }
  else {
    iVar1 = 0x19;
  }
  mixed_err(iVar1);
  return 0;
}

Assistant:

MIXED_EXPORT int mixed_register_segment(const char *name, uint32_t argc, struct mixed_segment_field_info *args, mixed_make_segment_function function){
  struct segment_entry *entry = 0;

  if(MIXED_MAX_MAKE_ARG_COUNT < argc){
    mixed_err(MIXED_BAD_ARGUMENT_COUNT);
    return 0;
  }

  uint32_t name_length = strlen(name);
  if(MIXED_MAX_SEGMENT_NAME_LENGTH < name_length){
    mixed_err(MIXED_BAD_NAME);
    return 0;
  }

  if(MIXED_MAX_SEGMENT_COUNT <= segments.count){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  for(uint32_t i=0; i<segments.count; ++i){
    struct segment_entry *cur_entry = &segments.entries[i];
    if(!entry && !cur_entry->function){
      entry = cur_entry;
    }else if(strcmp(cur_entry->name, name) == 0){
      mixed_err(MIXED_DUPLICATE_SEGMENT);
      return 0;
    }
  }

  if(!entry){
    entry = &segments.entries[segments.count];
  }

  memcpy(entry->name, name, name_length);
  entry->argc = argc;
  memcpy(entry->args, args, argc*sizeof(struct mixed_segment_field_info));
  entry->function = function;
  segments.count++;

  return 1;
}